

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

void Log::setFormat(String *lineFormat,String *timeFormat)

{
  Guard guard;
  Guard local_18;
  
  local_18._mutex = &_Log::mutex;
  Mutex::lock(&_Log::mutex);
  String::operator=(&_Log::lineFormat,lineFormat);
  String::operator=(&_Log::timeFormat,timeFormat);
  Mutex::Guard::~Guard(&local_18);
  return;
}

Assistant:

void Log::setFormat(const String& lineFormat, const String& timeFormat)
{
  Mutex::Guard guard(_Log::mutex);
  _Log::lineFormat = lineFormat;
  _Log::timeFormat = timeFormat;
}